

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O2

int object_set(object obj,char *key,value v)

{
  int iVar1;
  anon_union_8_4_8a094f32_for_data aVar2;
  accessor_type accessor;
  
  iVar1 = 1;
  if (((obj != (object)0x0) && (obj->interface != (object_interface)0x0)) &&
     (obj->interface->set != (object_impl_interface_set)0x0)) {
    aVar2.attr = class_attribute(obj->cls,key);
    if ((attribute)aVar2.key == (attribute)0x0) {
      if (obj->accessor == ACCESSOR_TYPE_DYNAMIC) {
        accessor.id = ACCESSOR_TYPE_DYNAMIC;
        accessor.data.key = key;
      }
      else {
        if (obj->accessor == ACCESSOR_TYPE_STATIC) {
          log_write_impl_va("metacall",0x12a,"object_set",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                            ,LOG_LEVEL_ERROR,"Attribute %s in object %s is not defined",key,
                            obj->name);
          return 3;
        }
        accessor.id = ACCESSOR_TYPE_DYNAMIC;
      }
    }
    else {
      accessor.id = ACCESSOR_TYPE_STATIC;
      accessor.data.attr = aVar2.attr;
    }
    iVar1 = (*obj->interface->set)(obj,obj->impl,&accessor,v);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      log_write_impl_va("metacall",0x13d,"object_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,LOG_LEVEL_ERROR,"Invalid class %s set of static attribute %s",obj->name,key
                       );
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

int object_set(object obj, const char *key, value v)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->set != NULL)
	{
		struct accessor_type accessor;
		attribute attr = class_attribute(obj->cls, key);

		if (attr == NULL)
		{
			switch (obj->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Attribute %s in object %s is not defined", key, obj->name);
					return 3;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		if (obj->interface->set(obj, obj->impl, &accessor, v) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s set of static attribute %s", obj->name, key);
			return 2;
		}

		return 0;
	}

	return 1;
}